

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

bool __thiscall absl::base_internal::SpinLock::TryLock(SpinLock *this)

{
  bool bVar1;
  bool res;
  SpinLock *this_local;
  
  bVar1 = TryLockImpl(this);
  return bVar1;
}

Assistant:

ABSL_EXCLUSIVE_TRYLOCK_FUNCTION(true) {
    ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
    bool res = TryLockImpl();
    ABSL_TSAN_MUTEX_POST_LOCK(
        this, __tsan_mutex_try_lock | (res ? 0 : __tsan_mutex_try_lock_failed),
        0);
    return res;
  }